

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestRequiredOneof::_InternalSerialize
          (TestRequiredOneof *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint32_t uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  int cached_size;
  int32_t value;
  MessageLite *value_00;
  int field_number;
  char *in_R9;
  undefined8 *puVar4;
  string_view s;
  string_view field_name;
  
  uVar1 = (this->field_0)._impl_._oneof_case_[0];
  switch(uVar1) {
  case 1:
    value = 0;
    if (uVar1 == 1) {
      value = *(int32_t *)&this->field_0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,value,target);
    break;
  case 2:
    if (uVar1 == 2) {
      puVar4 = (undefined8 *)((ulong)(this->field_0)._impl_.foo_.foo_message_ & 0xfffffffffffffffc);
    }
    else {
      puVar4 = &google::protobuf::internal::fixed_address_empty_string;
    }
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"proto2_unittest.TestRequiredOneof.foo_string";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x2c,field_name);
    s._M_str = (char *)*puVar4;
    s._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
    break;
  case 3:
    value_00 = *(MessageLite **)&this->field_0;
    cached_size = *(int *)((long)&value_00[1]._vptr_MessageLite + 4);
    field_number = 3;
    goto LAB_00ccc84c;
  case 4:
    value_00 = *(MessageLite **)&this->field_0;
    cached_size = *(int *)((long)&value_00[1]._vptr_MessageLite + 4);
    field_number = 4;
LAB_00ccc84c:
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (field_number,value_00,cached_size,target,stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRequiredOneof::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRequiredOneof& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestRequiredOneof)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  switch (this_.foo_case()) {
    case kFooInt: {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_foo_int(), target);
      break;
    }
    case kFooString: {
      const ::std::string& _s = this_._internal_foo_string();
      ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                  "proto2_unittest.TestRequiredOneof.foo_string");
      target = stream->WriteStringMaybeAliased(2, _s, target);
      break;
    }
    case kFooMessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          3, *this_._impl_.foo_.foo_message_, this_._impl_.foo_.foo_message_->GetCachedSize(), target,
          stream);
      break;
    }
    case kFooLazyMessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          4, *this_._impl_.foo_.foo_lazy_message_, this_._impl_.foo_.foo_lazy_message_->GetCachedSize(), target,
          stream);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestRequiredOneof)
  return target;
}